

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_manual_options_widget_base.h
# Opt level: O2

void __thiscall
Ui_ManualOptionsWidgetBase::setupUi
          (Ui_ManualOptionsWidgetBase *this,QWidget *ManualOptionsWidgetBase)

{
  storage_type *psVar1;
  QGridLayout *this_00;
  QLabel *pQVar2;
  QSlider *pQVar3;
  QLineEdit *pQVar4;
  QSpacerItem *pQVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QArrayDataPointer<char16_t> local_48;
  
  QObject::objectName();
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (local_48.size == 0) {
    psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("ManualOptionsWidgetBase",0x18);
    QVar6.m_data = psVar1;
    QVar6.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar6);
    QObject::setObjectName((QString *)ManualOptionsWidgetBase);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  QWidget::resize(ManualOptionsWidgetBase,0x188,0x4c);
  QWidget::sizePolicy();
  QWidget::setSizePolicy((QSizePolicy)SUB84(ManualOptionsWidgetBase,0));
  this_00 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(this_00,ManualOptionsWidgetBase);
  this->gridLayout = this_00;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("gridLayout",0xb);
  QVar7.m_data = psVar1;
  QVar7.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar7);
  QObject::setObjectName((QString *)this_00);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QLayout::setContentsMargins((int)this->gridLayout,4,4,4);
  pQVar2 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar2,ManualOptionsWidgetBase,0);
  this->blackPointLabel = pQVar2;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("blackPointLabel",0x10);
  QVar8.m_data = psVar1;
  QVar8.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar8);
  QObject::setObjectName((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QGridLayout::addWidget(this->gridLayout,this->blackPointLabel,0,0,1,1,0);
  pQVar3 = (QSlider *)operator_new(0x28);
  QSlider::QSlider(pQVar3,ManualOptionsWidgetBase);
  this->blackPointSlider = pQVar3;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("blackPointSlider",0x11);
  QVar9.m_data = psVar1;
  QVar9.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar9);
  QObject::setObjectName((QString *)pQVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  local_48.d = (Data *)0xc8;
  QWidget::setMinimumSize((QWidget *)this->blackPointSlider,(QSize *)&local_48);
  QAbstractSlider::setOrientation((Orientation)this->blackPointSlider);
  QGridLayout::addWidget(this->gridLayout,this->blackPointSlider,0,1,1,1,0);
  pQVar4 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(pQVar4,ManualOptionsWidgetBase);
  this->blackPointEdit = pQVar4;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("blackPointEdit",0xf);
  QVar10.m_data = psVar1;
  QVar10.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar10);
  QObject::setObjectName((QString *)pQVar4);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QWidget::sizePolicy();
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->blackPointEdit,0));
  local_48.d = (Data *)0x64;
  QWidget::setMinimumSize((QWidget *)this->blackPointEdit,(QSize *)&local_48);
  QLineEdit::setReadOnly(SUB81(this->blackPointEdit,0));
  QGridLayout::addWidget(this->gridLayout,this->blackPointEdit,0,2,1,1,0);
  pQVar2 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar2,ManualOptionsWidgetBase,0);
  this->whitePointLabel = pQVar2;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("whitePointLabel",0x10);
  QVar11.m_data = psVar1;
  QVar11.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar11);
  QObject::setObjectName((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QGridLayout::addWidget(this->gridLayout,this->whitePointLabel,1,0,1,1,0);
  pQVar3 = (QSlider *)operator_new(0x28);
  QSlider::QSlider(pQVar3,ManualOptionsWidgetBase);
  this->whitePointSlider = pQVar3;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("whitePointSlider",0x11);
  QVar12.m_data = psVar1;
  QVar12.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar12);
  QObject::setObjectName((QString *)pQVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  local_48.d = (Data *)0xc8;
  QWidget::setMinimumSize((QWidget *)this->whitePointSlider,(QSize *)&local_48);
  QAbstractSlider::setOrientation((Orientation)this->whitePointSlider);
  QGridLayout::addWidget(this->gridLayout,this->whitePointSlider,1,1,1,1,0);
  pQVar4 = (QLineEdit *)operator_new(0x28);
  QLineEdit::QLineEdit(pQVar4,ManualOptionsWidgetBase);
  this->whitePointEdit = pQVar4;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("whitePointEdit",0xf);
  QVar13.m_data = psVar1;
  QVar13.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar13);
  QObject::setObjectName((QString *)pQVar4);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QWidget::sizePolicy();
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->whitePointEdit,0));
  local_48.d = (Data *)0x64;
  QWidget::setMinimumSize((QWidget *)this->whitePointEdit,(QSize *)&local_48);
  QLineEdit::setReadOnly(SUB81(this->whitePointEdit,0));
  QGridLayout::addWidget(this->gridLayout,this->whitePointEdit,1,2,1,1,0);
  pQVar5 = (QSpacerItem *)operator_new(0x28);
  *(code **)pQVar5 = QImage::scanLine;
  *(undefined8 *)(pQVar5 + 8) = 0x13e00000000;
  *(undefined8 *)(pQVar5 + 0x10) = 0x71000000000006;
  *(undefined4 *)(pQVar5 + 0x18) = 0;
  *(undefined4 *)(pQVar5 + 0x1c) = 0;
  *(undefined4 *)(pQVar5 + 0x20) = 0xffffffff;
  *(undefined4 *)(pQVar5 + 0x24) = 0xffffffff;
  this->verticalSpacer = pQVar5;
  QGridLayout::addItem(this->gridLayout,pQVar5,2,0,1,3,0);
  retranslateUi(this,ManualOptionsWidgetBase);
  QMetaObject::connectSlotsByName((QObject *)ManualOptionsWidgetBase);
  return;
}

Assistant:

void setupUi(QWidget *ManualOptionsWidgetBase)
    {
        if (ManualOptionsWidgetBase->objectName().isEmpty())
            ManualOptionsWidgetBase->setObjectName(QString::fromUtf8("ManualOptionsWidgetBase"));
        ManualOptionsWidgetBase->resize(392, 76);
        QSizePolicy sizePolicy(QSizePolicy::Preferred, QSizePolicy::Maximum);
        sizePolicy.setHorizontalStretch(0);
        sizePolicy.setVerticalStretch(0);
        sizePolicy.setHeightForWidth(ManualOptionsWidgetBase->sizePolicy().hasHeightForWidth());
        ManualOptionsWidgetBase->setSizePolicy(sizePolicy);
        gridLayout = new QGridLayout(ManualOptionsWidgetBase);
        gridLayout->setObjectName(QString::fromUtf8("gridLayout"));
        gridLayout->setContentsMargins(4, 4, 4, 4);
        blackPointLabel = new QLabel(ManualOptionsWidgetBase);
        blackPointLabel->setObjectName(QString::fromUtf8("blackPointLabel"));

        gridLayout->addWidget(blackPointLabel, 0, 0, 1, 1);

        blackPointSlider = new QSlider(ManualOptionsWidgetBase);
        blackPointSlider->setObjectName(QString::fromUtf8("blackPointSlider"));
        blackPointSlider->setMinimumSize(QSize(200, 0));
        blackPointSlider->setOrientation(Qt::Horizontal);

        gridLayout->addWidget(blackPointSlider, 0, 1, 1, 1);

        blackPointEdit = new QLineEdit(ManualOptionsWidgetBase);
        blackPointEdit->setObjectName(QString::fromUtf8("blackPointEdit"));
        QSizePolicy sizePolicy1(QSizePolicy::Preferred, QSizePolicy::Fixed);
        sizePolicy1.setHorizontalStretch(0);
        sizePolicy1.setVerticalStretch(0);
        sizePolicy1.setHeightForWidth(blackPointEdit->sizePolicy().hasHeightForWidth());
        blackPointEdit->setSizePolicy(sizePolicy1);
        blackPointEdit->setMinimumSize(QSize(100, 0));
        blackPointEdit->setReadOnly(true);

        gridLayout->addWidget(blackPointEdit, 0, 2, 1, 1);

        whitePointLabel = new QLabel(ManualOptionsWidgetBase);
        whitePointLabel->setObjectName(QString::fromUtf8("whitePointLabel"));

        gridLayout->addWidget(whitePointLabel, 1, 0, 1, 1);

        whitePointSlider = new QSlider(ManualOptionsWidgetBase);
        whitePointSlider->setObjectName(QString::fromUtf8("whitePointSlider"));
        whitePointSlider->setMinimumSize(QSize(200, 0));
        whitePointSlider->setOrientation(Qt::Horizontal);

        gridLayout->addWidget(whitePointSlider, 1, 1, 1, 1);

        whitePointEdit = new QLineEdit(ManualOptionsWidgetBase);
        whitePointEdit->setObjectName(QString::fromUtf8("whitePointEdit"));
        sizePolicy1.setHeightForWidth(whitePointEdit->sizePolicy().hasHeightForWidth());
        whitePointEdit->setSizePolicy(sizePolicy1);
        whitePointEdit->setMinimumSize(QSize(100, 0));
        whitePointEdit->setReadOnly(true);

        gridLayout->addWidget(whitePointEdit, 1, 2, 1, 1);

        verticalSpacer = new QSpacerItem(318, 6, QSizePolicy::Minimum, QSizePolicy::Expanding);

        gridLayout->addItem(verticalSpacer, 2, 0, 1, 3);


        retranslateUi(ManualOptionsWidgetBase);

        QMetaObject::connectSlotsByName(ManualOptionsWidgetBase);
    }